

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_common.hxx
# Opt level: O0

void calc_server::loop(void)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  long *plVar4;
  bool cont;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string prompt;
  char cmd [1000];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb58;
  undefined6 in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb66;
  undefined1 in_stack_fffffffffffffb67;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb68;
  int local_478;
  int in_stack_fffffffffffffbac;
  string local_448 [15];
  char in_stack_fffffffffffffbc7;
  char *in_stack_fffffffffffffbc8;
  string local_428 [32];
  string local_408 [32];
  undefined1 local_3e8 [1000];
  
  std::__cxx11::to_string(in_stack_fffffffffffffbac);
  std::operator+((char *)in_stack_fffffffffffffb68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffb67,
                          CONCAT16(in_stack_fffffffffffffb66,in_stack_fffffffffffffb60)));
  std::operator+(in_stack_fffffffffffffb68,
                 (char *)CONCAT17(in_stack_fffffffffffffb67,
                                  CONCAT16(in_stack_fffffffffffffb66,in_stack_fffffffffffffb60)));
  std::__cxx11::string::~string(local_428);
  std::__cxx11::string::~string(local_448);
  do {
    poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[32m");
    poVar3 = std::operator<<(poVar3,local_408);
    std::operator<<(poVar3,"\x1b[0m");
    plVar4 = (long *)std::istream::getline((char *)&std::cin,(long)local_3e8);
    bVar1 = std::ios::operator!((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
    if ((bVar1 & 1) != 0) break;
    tokenize_abi_cxx11_(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc7);
    bVar2 = do_cmd(in_stack_fffffffffffffb58);
    if (bVar2) {
      local_478 = 0;
    }
    else {
      local_478 = 3;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)poVar3);
  } while (local_478 == 0);
  std::__cxx11::string::~string(local_408);
  return;
}

Assistant:

void loop() {
    char cmd[1000];
    std::string prompt = "calc " + std::to_string(stuff.server_id_) + "> ";
    while (true) {
#if defined(__linux__) || defined(__APPLE__)
        std::cout << _CLM_GREEN << prompt << _CLM_END;
#else
        std::cout << prompt;
#endif
        if (!std::cin.getline(cmd, 1000)) {
            break;
        }

        std::vector<std::string> tokens = tokenize(cmd);
        bool cont = do_cmd(tokens);
        if (!cont) break;
    }
}